

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

int trieste::yaml::reader(UI *ui,UI_STRING *uis)

{
  initializer_list<std::shared_ptr<trieste::PassDef>_> __l;
  shared_ptr<trieste::PassDef> *local_8b50;
  Parse local_8ab8;
  allocator<std::shared_ptr<trieste::PassDef>_> local_895a;
  undefined1 local_8959;
  PassDef local_8958;
  PassDef local_8048;
  PassDef local_7738;
  PassDef local_6e28;
  PassDef local_6518;
  PassDef local_5c08;
  PassDef local_52f8;
  PassDef local_49e8;
  PassDef local_40d8;
  PassDef local_37c8;
  PassDef local_2eb8;
  PassDef local_25a8;
  PassDef local_1c98;
  PassDef local_1388;
  PassDef local_a78;
  PassDef *local_168;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [79];
  allocator<char> local_31;
  string local_30;
  UI *local_10;
  
  local_10 = ui;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"yaml",&local_31);
  local_8959 = 1;
  local_168 = (PassDef *)local_160;
  anon_unknown.dwarf_23a488::groups();
  PassDef::operator_cast_to_shared_ptr((PassDef *)local_160);
  local_168 = (PassDef *)(local_160 + 0x10);
  anon_unknown.dwarf_23a488::values();
  PassDef::operator_cast_to_shared_ptr((PassDef *)(local_160 + 0x10));
  local_168 = (PassDef *)local_140;
  anon_unknown.dwarf_23a488::flow();
  PassDef::operator_cast_to_shared_ptr((PassDef *)local_140);
  local_168 = (PassDef *)(local_140 + 0x10);
  anon_unknown.dwarf_23a488::lines();
  PassDef::operator_cast_to_shared_ptr((PassDef *)(local_140 + 0x10));
  local_168 = (PassDef *)local_120;
  anon_unknown.dwarf_23a488::indents();
  PassDef::operator_cast_to_shared_ptr((PassDef *)local_120);
  local_168 = (PassDef *)(local_120 + 0x10);
  anon_unknown.dwarf_23a488::colgroups();
  PassDef::operator_cast_to_shared_ptr((PassDef *)(local_120 + 0x10));
  local_168 = (PassDef *)local_100;
  anon_unknown.dwarf_23a488::items();
  PassDef::operator_cast_to_shared_ptr((PassDef *)local_100);
  local_168 = (PassDef *)(local_100 + 0x10);
  anon_unknown.dwarf_23a488::complex();
  PassDef::operator_cast_to_shared_ptr((PassDef *)(local_100 + 0x10));
  local_168 = (PassDef *)local_e0;
  anon_unknown.dwarf_23a488::blocks();
  PassDef::operator_cast_to_shared_ptr((PassDef *)local_e0);
  local_168 = (PassDef *)(local_e0 + 0x10);
  anon_unknown.dwarf_23a488::collections();
  PassDef::operator_cast_to_shared_ptr((PassDef *)(local_e0 + 0x10));
  local_168 = (PassDef *)local_c0;
  anon_unknown.dwarf_23a488::attributes();
  PassDef::operator_cast_to_shared_ptr((PassDef *)local_c0);
  local_168 = (PassDef *)(local_c0 + 0x10);
  anon_unknown.dwarf_23a488::structure();
  PassDef::operator_cast_to_shared_ptr((PassDef *)(local_c0 + 0x10));
  local_168 = (PassDef *)local_a0;
  anon_unknown.dwarf_23a488::tags();
  PassDef::operator_cast_to_shared_ptr((PassDef *)local_a0);
  local_168 = (PassDef *)(local_a0 + 0x10);
  anon_unknown.dwarf_23a488::quotes();
  PassDef::operator_cast_to_shared_ptr((PassDef *)(local_a0 + 0x10));
  local_168 = (PassDef *)local_80;
  anon_unknown.dwarf_23a488::anchors();
  PassDef::operator_cast_to_shared_ptr((PassDef *)local_80);
  local_8959 = 0;
  local_80._16_8_ = local_160;
  local_80._24_8_ = (pointer)0xf;
  std::allocator<std::shared_ptr<trieste::PassDef>_>::allocator(&local_895a);
  __l._M_len = local_80._24_8_;
  __l._M_array = (iterator)local_80._16_8_;
  std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  vector((vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
          *)(local_80 + 0x20),__l,&local_895a);
  parser();
  Reader::Reader((Reader *)ui,&local_30,
                 (vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
                  *)(local_80 + 0x20),&local_8ab8);
  Parse::~Parse(&local_8ab8);
  CLI::std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  ~vector((vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
           *)(local_80 + 0x20));
  CLI::std::allocator<std::shared_ptr<trieste::PassDef>_>::~allocator(&local_895a);
  local_8b50 = (shared_ptr<trieste::PassDef> *)(local_80 + 0x10);
  do {
    local_8b50 = local_8b50 + -1;
    CLI::std::shared_ptr<trieste::PassDef>::~shared_ptr(local_8b50);
  } while (local_8b50 != (shared_ptr<trieste::PassDef> *)local_160);
  PassDef::~PassDef(&local_8958);
  PassDef::~PassDef(&local_8048);
  PassDef::~PassDef(&local_7738);
  PassDef::~PassDef(&local_6e28);
  PassDef::~PassDef(&local_6518);
  PassDef::~PassDef(&local_5c08);
  PassDef::~PassDef(&local_52f8);
  PassDef::~PassDef(&local_49e8);
  PassDef::~PassDef(&local_40d8);
  PassDef::~PassDef(&local_37c8);
  PassDef::~PassDef(&local_2eb8);
  PassDef::~PassDef(&local_25a8);
  PassDef::~PassDef(&local_1c98);
  PassDef::~PassDef(&local_1388);
  PassDef::~PassDef(&local_a78);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return (int)ui;
}

Assistant:

Reader reader()
    {
      return {
        "yaml",
        {
          groups(),
          values(),
          flow(),
          lines(),
          indents(),
          colgroups(),
          items(),
          complex(),
          blocks(),
          collections(),
          attributes(),
          structure(),
          tags(),
          quotes(),
          anchors(),
        },
        parser()};
    }